

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connection.cpp
# Opt level: O1

unique_ptr<KDIS::PDU::Header7,_std::default_delete<KDIS::PDU::Header7>_> __thiscall
KDIS::NETWORK::Connection::GetNextPDU(Connection *this,KString *SenderIp)

{
  KDataStream *this_00;
  size_type *psVar1;
  pointer pcVar2;
  long *plVar3;
  _func_int **pp_Var4;
  char cVar5;
  KUINT16 KVar6;
  KUINT16 KVar7;
  int iVar8;
  string *in_RDX;
  pointer *__ptr;
  pointer pcVar9;
  bool bVar10;
  KOCTET Buffer [8192];
  KOCTET local_2038 [8200];
  
  this_00 = (KDataStream *)(SenderIp + 4);
  KVar6 = KDataStream::GetBufferSize(this_00);
  if (KVar6 == 0) {
    psVar1 = &SenderIp[5]._M_string_length;
    iVar8 = (**(code **)((SenderIp->_M_dataplus)._M_p + 0x80))(SenderIp,local_2038,0x2000,psVar1);
    if (iVar8 != 0) {
      pcVar9 = SenderIp[3]._M_dataplus._M_p;
      pcVar2 = (pointer)SenderIp[3]._M_string_length;
      bVar10 = pcVar9 == pcVar2;
      if (bVar10) {
LAB_001263f0:
        KDataStream::Clear(this_00);
        KDataStream::CopyFromBuffer(this_00,local_2038,(KUINT16)iVar8,Big_Endian);
      }
      else {
        cVar5 = (**(code **)(**(long **)pcVar9 + 0x10))(*(long **)pcVar9,local_2038,iVar8,psVar1);
        while (cVar5 != '\0') {
          pcVar9 = pcVar9 + 8;
          bVar10 = pcVar9 == pcVar2;
          if (bVar10) goto LAB_001263f0;
          cVar5 = (**(code **)(**(long **)pcVar9 + 0x10))(*(long **)pcVar9,local_2038,iVar8,psVar1);
        }
        this->_vptr_Connection = (_func_int **)0x0;
      }
      if (!bVar10) {
        return (__uniq_ptr_data<KDIS::PDU::Header7,_std::default_delete<KDIS::PDU::Header7>,_true,_true>
                )(__uniq_ptr_data<KDIS::PDU::Header7,_std::default_delete<KDIS::PDU::Header7>,_true,_true>
                  )this;
      }
    }
  }
  KVar6 = KDataStream::GetBufferSize(this_00);
  if (KVar6 != 0) {
    if (in_RDX != (string *)0x0) {
      std::__cxx11::string::_M_assign(in_RDX);
    }
    KVar6 = KDataStream::GetCurrentWritePosition(this_00);
    plVar3 = *(long **)((long)&SenderIp[3].field_2 + 8);
    (**(code **)(*plVar3 + 8))(this,plVar3,this_00);
    pp_Var4 = this->_vptr_Connection;
    if (pp_Var4 == (_func_int **)0x0) {
      KDataStream::Clear(this_00);
    }
    else {
      pcVar2 = (pointer)SenderIp[3]._M_string_length;
      for (pcVar9 = SenderIp[3]._M_dataplus._M_p; pcVar9 != pcVar2; pcVar9 = pcVar9 + 8) {
        (**(code **)(**(long **)pcVar9 + 0x18))(*(long **)pcVar9,this->_vptr_Connection);
      }
      KVar7 = PDU::Header6::GetPDULength((Header6 *)this->_vptr_Connection);
      KDataStream::SetCurrentWritePosition(this_00,KVar7 + KVar6);
    }
    if (pp_Var4 != (_func_int **)0x0) {
      return (__uniq_ptr_data<KDIS::PDU::Header7,_std::default_delete<KDIS::PDU::Header7>,_true,_true>
              )(__uniq_ptr_data<KDIS::PDU::Header7,_std::default_delete<KDIS::PDU::Header7>,_true,_true>
                )this;
    }
    if (this->_vptr_Connection != (_func_int **)0x0) {
      (**(code **)(*this->_vptr_Connection + 8))();
    }
    this->_vptr_Connection = (_func_int **)0x0;
  }
  this->_vptr_Connection = (_func_int **)0x0;
  return (__uniq_ptr_data<KDIS::PDU::Header7,_std::default_delete<KDIS::PDU::Header7>,_true,_true>)
         (__uniq_ptr_data<KDIS::PDU::Header7,_std::default_delete<KDIS::PDU::Header7>,_true,_true>)
         this;
}

Assistant:

unique_ptr<Header> Connection::GetNextPDU(KString *SenderIp /* = 0 */ ) noexcept(false)
{
    // Are we currently dealing with a PDU Bundle, if so then dont read any new data.
    if( m_stream.GetBufferSize() == 0 )
    {
        // Get some new data from the network
        // Create a buffer to store network data
        KOCTET Buffer[MAX_PDU_SIZE];
        KINT32 iSz = Receive( Buffer, MAX_PDU_SIZE, &m_sLastIP );

        if( iSz )
        {
            // Fire the first event, this event can also be used to inform us if we should stop
            vector<ConnectionSubscriber*>::iterator itr = m_vpSubscribers.begin();
            vector<ConnectionSubscriber*>::iterator itrEnd = m_vpSubscribers.end();
            for( ; itr != itrEnd; ++itr )
            {
                if( !( *itr )->OnDataReceived( Buffer, iSz, m_sLastIP ) )
                {
                    // We should quit
                    return unique_ptr<Header>();
                }
            }

            // Create a new data stream
            m_stream.Clear();
            m_stream.CopyFromBuffer( Buffer, iSz );
        }
    }

    // Now process the stream
    if( m_stream.GetBufferSize() > 0 )
    {
        // Do they want the IP address returned?
        if( SenderIp )
        {
            *SenderIp = m_sLastIP;
        }

        // Get the current write position
        KUINT16 currentPos = m_stream.GetCurrentWritePosition();

        try
        {
            // Get the next/only PDU from the stream
            unique_ptr<Header> pdu = m_pPduFact->Decode( m_stream );

            // If the PDU was decoded successfully then fire the next event
            if( pdu.get() )
            {
                vector<ConnectionSubscriber*>::iterator itr = m_vpSubscribers.begin();
                vector<ConnectionSubscriber*>::iterator itrEnd = m_vpSubscribers.end();
                for( ; itr != itrEnd; ++itr )
                {
                    ( *itr )->OnPDUReceived( pdu.get() );
                }

                // Set the write pos for the next pdu. We do this here as its possible that when the PDU was decoded that some data may
				// have been left un-decoded so to be extra safe we use the reported pdu size and not the current stream.
                m_stream.SetCurrentWritePosition( currentPos + pdu->GetPDULength() );

                // Now return the decoded pdu
                return pdu;
            }
            else
            {
                // If a PDU could not be decoded in the PDU bundle, then we need to throw
                // out the whole stream. There is no way to know where the next PDU might start
                // in the data stream.
                m_stream.Clear();
            }
        }
        catch( const exception & e )
        {
            // Something went wrong, the stream is likely corrupted now so wipe it or we will have issues in the next GetNextPDU call.
            m_stream.Clear();
            throw;
        }
    }

    return unique_ptr<Header>(); // No data so Null ptr
}